

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

ON_2dSize __thiscall ON_4dRect::Size(ON_4dRect *this)

{
  ON_2dSize local_18;
  
  ON_2dSize::ON_2dSize(&local_18,ABS(this->right - this->left),ABS(this->bottom - this->top));
  return local_18;
}

Assistant:

double ON_4dRect::Width(void) const { return fabs(right - left); }